

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O0

MPP_RET mpp_packet_reset(MppPacketImpl *packet)

{
  void *pvVar1;
  size_t sVar2;
  MPP_RET MVar3;
  size_t size;
  void *data;
  MppPacketImpl *packet_local;
  
  MVar3 = check_is_mpp_packet_f(packet,"mpp_packet_reset");
  if (MVar3 == MPP_OK) {
    pvVar1 = packet->data;
    sVar2 = packet->size;
    memset(packet,0,0x148);
    packet->data = pvVar1;
    packet->pos = pvVar1;
    packet->size = sVar2;
    packet->name = module_name;
    mpp_packet_reset_segment(packet);
    packet_local._4_4_ = MPP_OK;
  }
  else {
    packet_local._4_4_ = MPP_ERR_UNKNOW;
  }
  return packet_local._4_4_;
}

Assistant:

MPP_RET mpp_packet_reset(MppPacketImpl *packet)
{
    if (check_is_mpp_packet(packet))
        return MPP_ERR_UNKNOW;

    void *data = packet->data;
    size_t size = packet->size;

    memset(packet, 0, sizeof(*packet));

    packet->data = data;
    packet->pos  = data;
    packet->size = size;
    setup_mpp_packet_name(packet);
    mpp_packet_reset_segment(packet);
    return MPP_OK;
}